

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

bool __thiscall PClassPlayerPawn::GetPainFlash(PClassPlayerPawn *this,FName *type,PalEntry *color)

{
  undefined8 in_RAX;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    if (this == (PClassPlayerPawn *)0x0) {
LAB_004ea617:
      return this != (PClassPlayerPawn *)0x0;
    }
    uStack_28 = CONCAT44(type->Index,(undefined4)uStack_28);
    paVar1 = &TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::CheckKey
                        (&this->PainFlashes,(FName *)((long)&uStack_28 + 4))->field_0;
    if (paVar1 != (anon_union_4_2_12391d7c_for_PalEntry_0 *)0x0) {
      (color->field_0).field_0 =
           *(anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 *)paVar1;
      goto LAB_004ea617;
    }
    this = dyn_cast<PClassPlayerPawn>((DObject *)(this->super_PClassActor).super_PClass.ParentClass)
    ;
  } while( true );
}

Assistant:

bool PClassPlayerPawn::GetPainFlash(FName type, PalEntry *color) const
{
	const PClassPlayerPawn *info = this;

	while (info != NULL)
	{
		const PalEntry *flash = info->PainFlashes.CheckKey(type);
		if (flash != NULL)
		{
			*color = *flash;
			return true;
		}
		// Try parent class
		info = dyn_cast<PClassPlayerPawn>(info->ParentClass);
	}
	return false;
}